

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O1

void test_skiplist_delete_empty(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  int key;
  ion_skiplist_t skiplist;
  undefined4 local_4c;
  ion_skiplist_t local_48;
  
  sl_initialize(&local_48,key_type_numeric_signed,4,10,7,1,4);
  local_48.super.compare = dictionary_compare_signed_value;
  local_4c = 3;
  iVar2 = sl_delete(&local_48,&local_4c);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2.error == '\x01'),0x357,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)((ulong)iVar2 >> 0x20 == 0),0x358,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      sl_destroy(&local_48);
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_delete_empty(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int				key		= 3;
	ion_status_t	status	= sl_delete(&skiplist, (ion_key_t) &key);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	sl_destroy(&skiplist);
}